

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<DataStream,unsigned_int,unsigned_int,CTxOut>
               (DataStream *s,uint *args,uint *args_1,CTxOut *args_2)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_writedata32<DataStream>(s,*args);
  ser_writedata32<DataStream>(s,*args_1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    CTxOut::SerializationOps<DataStream,CTxOut_const,ActionSerialize>(args_2,s);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}